

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O2

void CreateFAPOBase(FAPOBase *fapo,FAPORegistrationProperties *pRegistrationProperties,
                   uint8_t *pParameterBlocks,uint32_t uParameterBlockByteSize,uint8_t fProducer)

{
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,uParameterBlockByteSize,fProducer,
             SDL_malloc,SDL_free,SDL_realloc);
  return;
}

Assistant:

void CreateFAPOBase(
	FAPOBase *fapo,
	const FAPORegistrationProperties *pRegistrationProperties,
	uint8_t *pParameterBlocks,
	uint32_t uParameterBlockByteSize,
	uint8_t fProducer
) {
	CreateFAPOBaseWithCustomAllocatorEXT(
		fapo,
		pRegistrationProperties,
		pParameterBlocks,
		uParameterBlockByteSize,
		fProducer,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}